

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast_helper.hpp
# Opt level: O2

shared_ptr<TestDerivedType>
chaiscript::detail::Cast_Helper_Inner<std::shared_ptr<TestDerivedType>_>::cast
          (Boxed_Value *ob,Type_Conversions_State *param_2)

{
  __shared_ptr<TestDerivedType,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<TestDerivedType> sVar2;
  
  p_Var1 = &Any::cast<std::shared_ptr<TestDerivedType>>
                      ((Any *)((long)&(((param_2->m_conversions)._M_data)->m_mutex)._M_impl.
                                      _M_rwlock + 0x18))->
            super___shared_ptr<TestDerivedType,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<TestDerivedType,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<TestDerivedType,_(__gnu_cxx::_Lock_policy)2> *)ob,p_Var1);
  sVar2.super___shared_ptr<TestDerivedType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<TestDerivedType,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)ob;
  return (shared_ptr<TestDerivedType>)
         sVar2.super___shared_ptr<TestDerivedType,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto cast(const Boxed_Value &ob, const Type_Conversions_State *) { return ob.get().cast<std::shared_ptr<Result>>(); }